

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.c
# Opt level: O0

int emit_digits(char *digits,int ndigits,char *dest,int K,_Bool neg)

{
  int iVar1;
  undefined1 uVar2;
  int in_ECX;
  undefined1 *in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  byte in_R8B;
  int dec;
  int cent;
  char sign;
  int idx;
  int offset;
  int exp;
  int local_50;
  int local_4c;
  int local_44;
  int local_3c;
  int local_34;
  int local_2c;
  int local_4;
  
  if (in_ECX + in_ESI + -1 < 0) {
    local_44 = -(in_ECX + in_ESI + -1);
  }
  else {
    local_44 = in_ECX + in_ESI + -1;
  }
  local_2c = local_44;
  if ((in_ECX < 0) || (in_ESI + 7 <= local_44)) {
    if ((in_ECX < 0) && ((-7 < in_ECX || (local_44 < 4)))) {
      local_4c = in_ECX;
      if (in_ECX < 0) {
        local_4c = -in_ECX;
      }
      local_4c = in_ESI - local_4c;
      if (local_4c < 1) {
        local_4 = -local_4c;
        *in_RDX = 0x30;
        in_RDX[1] = 0x2e;
        memset(in_RDX + 2,0x30,(long)local_4);
        memcpy(in_RDX + (long)local_4 + 2,in_RDI,(long)in_ESI);
        local_4 = in_ESI + 2 + local_4;
      }
      else {
        memcpy(in_RDX,in_RDI,(long)local_4c);
        in_RDX[local_4c] = 0x2e;
        memcpy(in_RDX + (long)local_4c + 1,in_RDI + local_4c,(long)(in_ESI - local_4c));
        local_4 = in_ESI + 1;
      }
    }
    else {
      local_50 = in_ESI;
      if ((int)(0x12 - (uint)(in_R8B & 1)) <= in_ESI) {
        local_50 = 0x12 - (uint)(in_R8B & 1);
      }
      local_34 = 1;
      *in_RDX = *in_RDI;
      if (1 < local_50) {
        in_RDX[1] = 0x2e;
        memcpy(in_RDX + 2,in_RDI + 1,(long)(local_50 + -1));
        local_34 = local_50 + 1;
      }
      in_RDX[local_34] = 0x65;
      uVar2 = 0x2b;
      if (in_ECX + local_50 + -1 < 0) {
        uVar2 = 0x2d;
      }
      in_RDX[local_34 + 1] = uVar2;
      local_3c = 0;
      iVar1 = local_34 + 2;
      if (99 < local_44) {
        local_3c = local_44 / 100;
        in_RDX[local_34 + 2] = (char)local_3c + '0';
        local_2c = local_44 % 100;
        iVar1 = local_34 + 3;
      }
      local_34 = iVar1;
      if (local_2c < 10) {
        if (local_3c != 0) {
          in_RDX[local_34] = 0x30;
          local_34 = local_34 + 1;
        }
      }
      else {
        in_RDX[local_34] = (char)(local_2c / 10) + '0';
        local_2c = local_2c % 10;
        local_34 = local_34 + 1;
      }
      local_4 = local_34 + 1;
      in_RDX[local_34] = (char)(local_2c % 10) + '0';
    }
  }
  else {
    memcpy(in_RDX,in_RDI,(long)in_ESI);
    memset(in_RDX + in_ESI,0x30,(long)in_ECX);
    local_4 = in_ESI + in_ECX;
  }
  return local_4;
}

Assistant:

static int emit_digits(char* digits, int ndigits, char* dest, int K, bool neg)
{
    int exp = absv(K + ndigits - 1);

    /* write plain integer */
    if(K >= 0 && (exp < (ndigits + 7))) {
        memcpy(dest, digits, ndigits);
        memset(dest + ndigits, '0', K);

        return ndigits + K;
    }

    /* write decimal w/o scientific notation */
    if(K < 0 && (K > -7 || exp < 4)) {
        int offset = ndigits - absv(K);
        /* fp < 1.0 -> write leading zero */
        if(offset <= 0) {
            offset = -offset;
            dest[0] = '0';
            dest[1] = '.';
            memset(dest + 2, '0', offset);
            memcpy(dest + offset + 2, digits, ndigits);

            return ndigits + 2 + offset;

        /* fp > 1.0 */
        } else {
            memcpy(dest, digits, offset);
            dest[offset] = '.';
            memcpy(dest + offset + 1, digits + offset, ndigits - offset);

            return ndigits + 1;
        }
    }

    /* write decimal w/ scientific notation */
    ndigits = minv(ndigits, 18 - neg);

    int idx = 0;
    dest[idx++] = digits[0];

    if(ndigits > 1) {
        dest[idx++] = '.';
        memcpy(dest + idx, digits + 1, ndigits - 1);
        idx += ndigits - 1;
    }

    dest[idx++] = 'e';

    char sign = K + ndigits - 1 < 0 ? '-' : '+';
    dest[idx++] = sign;

    int cent = 0;

    if(exp > 99) {
        cent = exp / 100;
        dest[idx++] = cent + '0';
        exp -= cent * 100;
    }
    if(exp > 9) {
        int dec = exp / 10;
        dest[idx++] = dec + '0';
        exp -= dec * 10;

    } else if(cent) {
        dest[idx++] = '0';
    }

    dest[idx++] = exp % 10 + '0';

    return idx;
}